

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O2

void gen_addv_mask(TCGContext_conflict9 *tcg_ctx,TCGv_i64 d,TCGv_i64 a,TCGv_i64 b,TCGv_i64 m)

{
  TCGv_i64 ret;
  TCGv_i64 ret_00;
  TCGv_i64 ret_01;
  uintptr_t o;
  uintptr_t o_2;
  uintptr_t o_1;
  
  ret = tcg_temp_new_i64(tcg_ctx);
  ret_00 = tcg_temp_new_i64(tcg_ctx);
  ret_01 = tcg_temp_new_i64(tcg_ctx);
  tcg_gen_andc_i64_tricore(tcg_ctx,ret,a,m);
  tcg_gen_andc_i64_tricore(tcg_ctx,ret_00,b,m);
  tcg_gen_xor_i64_tricore(tcg_ctx,ret_01,a,b);
  tcg_gen_add_i64(tcg_ctx,d,ret,ret_00);
  tcg_gen_and_i64_tricore(tcg_ctx,ret_01,ret_01,m);
  tcg_gen_xor_i64_tricore(tcg_ctx,d,d,ret_01);
  tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
  tcg_temp_free_internal_tricore(tcg_ctx,(TCGTemp *)(ret_01 + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_addv_mask(TCGContext *tcg_ctx, TCGv_i64 d, TCGv_i64 a, TCGv_i64 b, TCGv_i64 m)
{
    TCGv_i64 t1 = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 t2 = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 t3 = tcg_temp_new_i64(tcg_ctx);

    tcg_gen_andc_i64(tcg_ctx, t1, a, m);
    tcg_gen_andc_i64(tcg_ctx, t2, b, m);
    tcg_gen_xor_i64(tcg_ctx, t3, a, b);
    tcg_gen_add_i64(tcg_ctx, d, t1, t2);
    tcg_gen_and_i64(tcg_ctx, t3, t3, m);
    tcg_gen_xor_i64(tcg_ctx, d, d, t3);

    tcg_temp_free_i64(tcg_ctx, t1);
    tcg_temp_free_i64(tcg_ctx, t2);
    tcg_temp_free_i64(tcg_ctx, t3);
}